

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_hdr_register_hrec(bcf_hdr_t *hdr,bcf_hrec_t *hrec)

{
  char *pcVar1;
  kh_vdict_t *pkVar2;
  bcf_idinfo_t *pbVar3;
  bool bVar4;
  int iVar5;
  khint_t kVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  int j;
  int ret;
  char *tmp;
  int local_5c;
  uint32_t local_58;
  int local_54;
  undefined8 local_50;
  int local_44;
  char *local_40;
  bcf_hdr_t *local_38;
  
  pcVar7 = hrec->key;
  iVar5 = strcmp(pcVar7,"contig");
  if (iVar5 == 0) {
    hrec->type = 3;
    uVar8 = bcf_hrec_find_key(hrec,"length");
    if ((int)uVar8 < 0) {
      local_58 = 0;
    }
    else {
      iVar5 = __isoc99_sscanf(hrec->vals[uVar8],"%d",&local_58);
      if (iVar5 != 1) {
        return 0;
      }
    }
    uVar8 = bcf_hrec_find_key(hrec,"ID");
    if ((int)uVar8 < 0) {
      return 0;
    }
    pcVar7 = strdup(hrec->vals[uVar8]);
    pkVar2 = (kh_vdict_t *)hdr->dict[1];
    kVar6 = kh_put_vdict(pkVar2,pcVar7,&local_44);
    if (local_44 == 0) {
      free(pcVar7);
      return 0;
    }
    iVar5 = bcf_hrec_find_key(hrec,"IDX");
    if (iVar5 == -1) {
      iVar5 = pkVar2->size - 1;
      hrec_add_idx(hrec,iVar5);
    }
    else {
      local_40 = hrec->vals[iVar5];
      lVar9 = strtol(local_40,&local_40,10);
      iVar5 = (int)lVar9;
      if (*local_40 != '\0') {
        fprintf(_stderr,"[%s:%d %s] Error parsing the IDX tag, skipping.\n",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                ,0x178,"bcf_hdr_register_hrec");
        return 0;
      }
    }
    pbVar3 = pkVar2->vals;
    pbVar3[(int)kVar6].hrec[2] = (bcf_hrec_t *)0x0;
    (pbVar3[(int)kVar6].hrec + 2)[1] = (bcf_hrec_t *)0xffffffff;
    pbVar3[(int)kVar6].hrec[0] = (bcf_hrec_t *)0x0;
    pbVar3[(int)kVar6].hrec[1] = (bcf_hrec_t *)0x0;
    pbVar3 = pbVar3 + (int)kVar6;
    pbVar3->info[0] = 0xf;
    pbVar3->info[1] = 0xf;
    *(undefined8 *)(pbVar3->info + 2) = 0xf;
    pbVar3 = pkVar2->vals;
    pbVar3[(int)kVar6].id = iVar5;
    pbVar3[(int)kVar6].info[0] = local_58;
    pbVar3[(int)kVar6].hrec[0] = hrec;
LAB_00118d24:
    iVar5 = 1;
  }
  else {
    iVar5 = strcmp(pcVar7,"INFO");
    if (iVar5 == 0) {
      iVar5 = 1;
    }
    else {
      iVar5 = strcmp(pcVar7,"FILTER");
      if (iVar5 == 0) {
        iVar5 = 0;
      }
      else {
        iVar5 = strcmp(pcVar7,"FORMAT");
        if (iVar5 != 0) {
          if (hrec->nkeys < 1) {
            return 0;
          }
          hrec->type = 4;
          goto LAB_00118d24;
        }
        iVar5 = 2;
      }
    }
    hrec->type = iVar5;
    local_58 = 0xffffffff;
    if (hrec->nkeys < 1) {
      uVar8 = 0xfffffff0;
      iVar5 = -1;
      pcVar7 = (char *)0x0;
    }
    else {
      lVar9 = 0xffffffff;
      lVar11 = 0;
      local_54 = -1;
      local_5c = -1;
      pcVar7 = (char *)0x0;
      local_38 = hdr;
      do {
        pcVar1 = hrec->keys[lVar11];
        iVar5 = strcmp(pcVar1,"ID");
        if (iVar5 == 0) {
          pcVar7 = hrec->vals[lVar11];
        }
        else {
          iVar5 = strcmp(pcVar1,"IDX");
          if (iVar5 == 0) {
            local_40 = hrec->vals[lVar11];
            lVar9 = strtol(local_40,&local_40,10);
            if (*local_40 != '\0') {
              local_50 = 0;
              fprintf(_stderr,"[%s:%d %s] Error parsing the IDX tag, skipping.\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                      ,0x19c,"bcf_hdr_register_hrec");
              goto LAB_00118cb5;
            }
          }
          else {
            iVar5 = strcmp(pcVar1,"Type");
            if (iVar5 == 0) {
              pcVar1 = hrec->vals[lVar11];
              iVar5 = strcmp(pcVar1,"Integer");
              if (iVar5 == 0) {
                local_5c = 1;
              }
              else {
                iVar5 = strcmp(pcVar1,"Float");
                if (iVar5 == 0) {
                  local_5c = 2;
                }
                else {
                  iVar5 = strcmp(pcVar1,"String");
                  local_5c = 3;
                  if ((iVar5 != 0) && (iVar5 = strcmp(pcVar1,"Character"), iVar5 != 0)) {
                    iVar5 = strcmp(pcVar1,"Flag");
                    if (iVar5 == 0) {
                      local_5c = 0;
                    }
                    else {
                      fprintf(_stderr,"[E::%s] The type \"%s\" not supported, assuming \"String\"\n"
                              ,"bcf_hdr_register_hrec");
                    }
                  }
                }
              }
            }
            else {
              iVar5 = strcmp(pcVar1,"Number");
              if (iVar5 == 0) {
                pcVar1 = hrec->vals[lVar11];
                iVar5 = strcmp(pcVar1,"A");
                bVar4 = false;
                if (iVar5 == 0) {
                  local_54 = 2;
                }
                else {
                  iVar5 = strcmp(pcVar1,"R");
                  if (iVar5 == 0) {
                    local_54 = 4;
                  }
                  else {
                    iVar5 = strcmp(pcVar1,"G");
                    if (iVar5 == 0) {
                      local_54 = 3;
                    }
                    else {
                      iVar5 = strcmp(pcVar1,".");
                      if (iVar5 != 0) {
                        __isoc99_sscanf(pcVar1,"%d",&local_58);
                        bVar4 = true;
                        local_54 = 0;
                        goto LAB_00118b0c;
                      }
                      local_54 = 1;
                    }
                  }
                  bVar4 = false;
                }
LAB_00118b0c:
                if (bVar4) {
                  local_54 = 0;
                }
                else {
                  local_58 = 0xfffff;
                }
              }
            }
          }
        }
        iVar5 = (int)lVar9;
        lVar11 = lVar11 + 1;
      } while (lVar11 < hrec->nkeys);
      uVar8 = local_5c << 4 | local_54 << 8;
      hdr = local_38;
    }
    local_50 = 0;
    if (pcVar7 != (char *)0x0) {
      uVar10 = hrec->type;
      uVar8 = uVar8 | uVar10 | local_58 << 0xc;
      pcVar7 = strdup(pcVar7);
      pkVar2 = (kh_vdict_t *)hdr->dict[0];
      kVar6 = kh_put_vdict(pkVar2,pcVar7,&local_44);
      if (local_44 == 0) {
        free(pcVar7);
        pbVar3 = pkVar2->vals;
        uVar10 = uVar10 & 0xf;
        if (pbVar3[(int)kVar6].hrec[uVar10] == (bcf_hrec_t *)0x0) {
          pbVar3[(int)kVar6].info[uVar10] = uVar8;
          pbVar3[(int)kVar6].hrec[uVar10] = hrec;
          local_50 = 1;
          if (iVar5 == -1) {
            hrec_add_idx(hrec,pkVar2->vals[(int)kVar6].id);
          }
        }
      }
      else {
        pbVar3 = pkVar2->vals;
        pbVar3[(int)kVar6].hrec[2] = (bcf_hrec_t *)0x0;
        (pbVar3[(int)kVar6].hrec + 2)[1] = (bcf_hrec_t *)0xffffffff;
        pbVar3[(int)kVar6].hrec[0] = (bcf_hrec_t *)0x0;
        pbVar3[(int)kVar6].hrec[1] = (bcf_hrec_t *)0x0;
        pbVar3 = pbVar3 + (int)kVar6;
        pbVar3->info[0] = 0xf;
        pbVar3->info[1] = 0xf;
        *(undefined8 *)(pbVar3->info + 2) = 0xf;
        pbVar3 = pkVar2->vals;
        pbVar3[(int)kVar6].info[uVar10 & 0xf] = uVar8;
        pbVar3[(int)kVar6].hrec[uVar10 & 0xf] = hrec;
        if (iVar5 == -1) {
          iVar5 = pkVar2->size - 1;
          pkVar2->vals[(int)kVar6].id = iVar5;
          hrec_add_idx(hrec,iVar5);
        }
        else {
          pkVar2->vals[(int)kVar6].id = iVar5;
        }
        local_50 = 1;
      }
    }
LAB_00118cb5:
    iVar5 = (int)local_50;
  }
  return iVar5;
}

Assistant:

int bcf_hdr_register_hrec(bcf_hdr_t *hdr, bcf_hrec_t *hrec)
{
    // contig
    int i,j,k, ret;
    char *str;
    if ( !strcmp(hrec->key, "contig") )
    {
        hrec->type = BCF_HL_CTG;

        // Get the contig ID ($str) and length ($j)
        i = bcf_hrec_find_key(hrec,"length");
        if ( i<0 ) j = 0;
        else if ( sscanf(hrec->vals[i],"%d",&j)!=1 ) return 0;

        i = bcf_hrec_find_key(hrec,"ID");
        if ( i<0 ) return 0;
        str = strdup(hrec->vals[i]);

        // Register in the dictionary
        vdict_t *d = (vdict_t*)hdr->dict[BCF_DT_CTG];
        k = kh_put(vdict, d, str, &ret);
        if ( !ret ) { free(str); return 0; }    // already present

        int idx = bcf_hrec_find_key(hrec,"IDX");
        if ( idx!=-1 )
        {
            char *tmp = hrec->vals[idx];
            idx = strtol(hrec->vals[idx], &tmp, 10);
            if ( *tmp )
            {
                fprintf(stderr,"[%s:%d %s] Error parsing the IDX tag, skipping.\n", __FILE__,__LINE__,__FUNCTION__);
                return 0;
            }
        }
        else
        {
            idx = kh_size(d) - 1;
            hrec_add_idx(hrec, idx);
        }

        kh_val(d, k) = bcf_idinfo_def;
        kh_val(d, k).id = idx;
        kh_val(d, k).info[0] = j;
        kh_val(d, k).hrec[0] = hrec;

        return 1;
    }

    if ( !strcmp(hrec->key, "INFO") ) hrec->type = BCF_HL_INFO;
    else if ( !strcmp(hrec->key, "FILTER") ) hrec->type = BCF_HL_FLT;
    else if ( !strcmp(hrec->key, "FORMAT") ) hrec->type = BCF_HL_FMT;
    else if ( hrec->nkeys>0 ) { hrec->type = BCF_HL_STR; return 1; }
    else return 0;

    // INFO/FILTER/FORMAT
    char *id = NULL;
    int type = -1, num = -1, var = -1, idx = -1;
    for (i=0; i<hrec->nkeys; i++)
    {
        if ( !strcmp(hrec->keys[i], "ID") ) id = hrec->vals[i];
        else if ( !strcmp(hrec->keys[i], "IDX") )
        {
            char *tmp = hrec->vals[i];
            idx = strtol(hrec->vals[i], &tmp, 10);
            if ( *tmp )
            {
                fprintf(stderr,"[%s:%d %s] Error parsing the IDX tag, skipping.\n", __FILE__,__LINE__,__FUNCTION__);
                return 0;
            }
        }
        else if ( !strcmp(hrec->keys[i], "Type") )
        {
            if ( !strcmp(hrec->vals[i], "Integer") ) type = BCF_HT_INT;
            else if ( !strcmp(hrec->vals[i], "Float") ) type = BCF_HT_REAL;
            else if ( !strcmp(hrec->vals[i], "String") ) type = BCF_HT_STR;
            else if ( !strcmp(hrec->vals[i], "Character") ) type = BCF_HT_STR;
            else if ( !strcmp(hrec->vals[i], "Flag") ) type = BCF_HT_FLAG;
            else
            {
                fprintf(stderr, "[E::%s] The type \"%s\" not supported, assuming \"String\"\n", __func__, hrec->vals[i]);
                type = BCF_HT_STR;
            }
        }
        else if ( !strcmp(hrec->keys[i], "Number") )
        {
            if ( !strcmp(hrec->vals[i],"A") ) var = BCF_VL_A;
            else if ( !strcmp(hrec->vals[i],"R") ) var = BCF_VL_R;
            else if ( !strcmp(hrec->vals[i],"G") ) var = BCF_VL_G;
            else if ( !strcmp(hrec->vals[i],".") ) var = BCF_VL_VAR;
            else
            {
                sscanf(hrec->vals[i],"%d",&num);
                var = BCF_VL_FIXED;
            }
            if (var != BCF_VL_FIXED) num = 0xfffff;
        }
    }
    uint32_t info = (uint32_t)num<<12 | var<<8 | type<<4 | hrec->type;

    if ( !id ) return 0;
    str = strdup(id);

    vdict_t *d = (vdict_t*)hdr->dict[BCF_DT_ID];
    k = kh_put(vdict, d, str, &ret);
    if ( !ret )
    {
        // already present
        free(str);
        if ( kh_val(d, k).hrec[info&0xf] ) return 0;
        kh_val(d, k).info[info&0xf] = info;
        kh_val(d, k).hrec[info&0xf] = hrec;
        if ( idx==-1 ) hrec_add_idx(hrec, kh_val(d, k).id);
        return 1;
    }
    kh_val(d, k) = bcf_idinfo_def;
    kh_val(d, k).info[info&0xf] = info;
    kh_val(d, k).hrec[info&0xf] = hrec;
    kh_val(d, k).id = idx==-1 ? kh_size(d) - 1 : idx;

    if ( idx==-1 ) hrec_add_idx(hrec, kh_val(d, k).id);

    return 1;
}